

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  size_type sVar8;
  int iVar9;
  bool bVar10;
  AssertionResult assertionResult;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  ITransientExpression *local_e0;
  bool bStack_d8;
  undefined7 uStack_d7;
  OfType local_d0;
  AssertionResult local_c8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar4 = (info->macroName).m_start;
  sVar5 = (info->macroName).m_size;
  pcVar6 = (info->lineInfo).file;
  sVar7 = (info->lineInfo).line;
  sVar8 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar8;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar6;
  (this->m_lastAssertionInfo).lineInfo.line = sVar7;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar4;
  (this->m_lastAssertionInfo).macroName.m_size = sVar5;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_e0 = (ITransientExpression *)0x0;
  bStack_d8 = false;
  local_d0 = ThrewException;
  local_120 = &local_110;
  local_100 = &local_f0;
  std::__cxx11::string::operator=((string *)&local_120,(string *)message);
  local_c8.m_info.resultDisposition = info->resultDisposition;
  local_c8.m_info._52_4_ = *(undefined4 *)&info->field_0x34;
  paVar1 = &local_c8.m_resultData.message.field_2;
  local_c8.m_info.macroName.m_start = (info->macroName).m_start;
  local_c8.m_info.macroName.m_size = (info->macroName).m_size;
  local_c8.m_info.lineInfo.file = (info->lineInfo).file;
  local_c8.m_info.lineInfo.line = (info->lineInfo).line;
  local_c8.m_info.capturedExpression.m_start = (info->capturedExpression).m_start;
  local_c8.m_info.capturedExpression.m_size = (info->capturedExpression).m_size;
  if (local_120 == &local_110) {
    local_c8.m_resultData.message.field_2._8_8_ = local_110._8_8_;
    local_c8.m_resultData.message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.m_resultData.message._M_dataplus._M_p = (pointer)local_120;
  }
  local_c8.m_resultData.message.field_2._M_allocated_capacity._1_7_ =
       local_110._M_allocated_capacity._1_7_;
  local_c8.m_resultData.message.field_2._M_local_buf[0] = local_110._M_local_buf[0];
  paVar2 = &local_c8.m_resultData.reconstructedExpression.field_2;
  local_c8.m_resultData.message._M_string_length = local_118;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  if (local_100 == &local_f0) {
    local_c8.m_resultData.reconstructedExpression.field_2._8_8_ = local_f0._8_8_;
    local_c8.m_resultData.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c8.m_resultData.reconstructedExpression._M_dataplus._M_p = (pointer)local_100;
  }
  local_c8.m_resultData.reconstructedExpression.field_2._M_allocated_capacity._1_7_ =
       local_f0._M_allocated_capacity._1_7_;
  local_c8.m_resultData.reconstructedExpression.field_2._M_local_buf[0] = local_f0._M_local_buf[0];
  local_c8.m_resultData.reconstructedExpression._M_string_length = local_f8;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_c8.m_resultData.lazyExpression._9_7_ = uStack_d7;
  local_c8.m_resultData.lazyExpression.m_isNegated = bStack_d8;
  local_c8.m_resultData.lazyExpression.m_transientExpression = local_e0;
  local_c8.m_resultData.resultType = local_d0;
  local_120 = &local_110;
  local_100 = &local_f0;
  assertionEnded(this,&local_c8);
  iVar9 = (*this->m_config->_vptr_IConfig[5])();
  reaction->shouldDebugBreak = SUB41(iVar9,0);
  uVar3 = (this->m_totals).assertions.failed;
  iVar9 = (*this->m_config->_vptr_IConfig[9])();
  bVar10 = true;
  if (uVar3 < (ulong)(long)iVar9) {
    bVar10 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
  }
  reaction->shouldThrow = bVar10;
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_resultData.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_c8.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_resultData.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_resultData.message._M_dataplus._M_p,
                    local_c8.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,
                    CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,
                    CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string&& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = CATCH_MOVE(message);
        AssertionResult assertionResult{ info, CATCH_MOVE(data) };
        assertionEnded( CATCH_MOVE(assertionResult) );
        populateReaction( reaction );
        resetAssertionInfo();
    }